

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitNot
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,NotExpr e)

{
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
  *in_RDI;
  int in_stack_00000014;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *in_stack_00000018;
  LogicalExpr arg;
  BasicWriter<char> *in_stack_ffffffffffffffd0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_ffffffffffffffd8;
  
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,(char)((ulong)in_RDI >> 0x38));
  other = BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
          ::arg(in_RDI);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            (in_stack_ffffffffffffffd8,other,other.super_ExprBase.impl_._4_4_);
  precedence((Expr)0x19aa63);
  Visit(in_stack_00000018,arg,in_stack_00000014);
  return;
}

Assistant:

void VisitNot(NotExpr e) {
     writer_ << '!';
     // Use a precedence higher then relational to print expressions
     // as "!(x = y)" instead of "!x = y".
     LogicalExpr arg = e.arg();
     Visit(arg,
           precedence(arg) == prec::RELATIONAL ? prec::RELATIONAL + 1 : -1);
  }